

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

bool __thiscall
spirv_cross::CompilerMSL::OpCodePreprocessor::handle
          (OpCodePreprocessor *this,Op opcode,uint32_t *args,uint32_t length)

{
  uint id;
  mapped_type mVar1;
  bool bVar2;
  __node_base_ptr p_Var3;
  mapped_type *pmVar4;
  SPIRVariable *pSVar5;
  key_type var_id;
  uint32_t uVar6;
  _Hash_node_base *p_Var7;
  uint32_t result_id;
  uint32_t result_type;
  SPVFuncImpl spv_func;
  uint32_t local_44;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_40;
  SPVFuncImpl local_34;
  
  local_34 = get_spv_func_impl(this,opcode,args);
  if (local_34 != SPVFuncImplNone) {
    ::std::
    _Rb_tree<spirv_cross::CompilerMSL::SPVFuncImpl,spirv_cross::CompilerMSL::SPVFuncImpl,std::_Identity<spirv_cross::CompilerMSL::SPVFuncImpl>,std::less<spirv_cross::CompilerMSL::SPVFuncImpl>,std::allocator<spirv_cross::CompilerMSL::SPVFuncImpl>>
    ::_M_insert_unique<spirv_cross::CompilerMSL::SPVFuncImpl_const&>
              ((_Rb_tree<spirv_cross::CompilerMSL::SPVFuncImpl,spirv_cross::CompilerMSL::SPVFuncImpl,std::_Identity<spirv_cross::CompilerMSL::SPVFuncImpl>,std::less<spirv_cross::CompilerMSL::SPVFuncImpl>,std::allocator<spirv_cross::CompilerMSL::SPVFuncImpl>>
                *)&this->compiler->spv_function_implementations,&local_34);
    this->suppress_missing_prototypes = true;
  }
  if ((int)opcode < 0xe5) {
    if ((int)opcode < 99) {
      switch(opcode) {
      case OpFunctionCall:
        this->suppress_missing_prototypes = true;
        break;
      case OpImageTexelPointer:
        pSVar5 = Compiler::maybe_get_backing_variable((Compiler *)this->compiler,args[2]);
        if (pSVar5 == (SPIRVariable *)0x0) {
          uVar6 = 0;
        }
        else {
          uVar6 = (pSVar5->super_IVariant).self.id;
        }
        pmVar4 = ::std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->image_pointers,args + 1);
        *pmVar4 = uVar6;
        break;
      case OpStore:
        goto switchD_002872cc_caseD_3e;
      case OpAccessChain:
      case OpInBoundsAccessChain:
      case OpPtrAccessChain:
        local_40 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)CONCAT44(local_40._4_4_,*args);
        id = args[1];
        uVar6 = args[2];
        local_44 = CONCAT31(local_44._1_3_,1);
        Compiler::set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int&,bool>
                  ((Compiler *)this->compiler,id,(char (*) [1])0x2dc0a8,(uint *)&local_40,
                   (bool *)&local_44);
        Compiler::register_read((Compiler *)this->compiler,id,uVar6,true);
        (this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
        super_VectorView<spirv_cross::Variant>.ptr[id].allow_type_rewrite = true;
        break;
      case OpArrayLength:
        pSVar5 = Compiler::maybe_get_backing_variable((Compiler *)this->compiler,args[2]);
        if (pSVar5 != (SPIRVariable *)0x0) {
          local_40 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&this->compiler->buffers_requiring_array_length;
          local_44 = (pSVar5->super_IVariant).self.id;
          ::std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ();
        }
      }
      goto switchD_002872cc_caseD_3a;
    }
    if (opcode == OpImageWrite) {
      this->uses_resource_write = true;
      goto switchD_002872cc_caseD_3a;
    }
    if (opcode == OpAtomicLoad) {
      this->uses_atomics = true;
      p_Var7 = (_Hash_node_base *)0x0;
      p_Var3 = ::std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::_M_find_before_node
                         (&(this->image_pointers)._M_h,
                          (ulong)args[2] % (this->image_pointers)._M_h._M_bucket_count,args + 2,
                          (ulong)args[2]);
      if (p_Var3 != (__node_base_ptr)0x0) {
        p_Var7 = p_Var3->_M_nxt;
      }
      if (p_Var7 != (_Hash_node_base *)0x0) {
        local_40 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&this->compiler->atomic_image_vars;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  (local_40,(undefined1 *)((long)&p_Var7[1]._M_nxt + 4));
      }
      goto switchD_002872cc_caseD_3a;
    }
    if (opcode != OpAtomicStore) goto switchD_002872cc_caseD_3a;
    this->uses_atomics = true;
    p_Var7 = (_Hash_node_base *)0x0;
    p_Var3 = ::std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::_M_find_before_node
                       (&(this->image_pointers)._M_h,
                        (ulong)*args % (this->image_pointers)._M_h._M_bucket_count,args,(ulong)*args
                       );
    if (p_Var3 != (__node_base_ptr)0x0) {
      p_Var7 = p_Var3->_M_nxt;
    }
    if (p_Var7 != (_Hash_node_base *)0x0) {
      local_40 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&this->compiler->atomic_image_vars;
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                (local_40,(undefined1 *)((long)&p_Var7[1]._M_nxt + 4));
    }
switchD_002872cc_caseD_3e:
    var_id = *args;
  }
  else {
    if (0xd < opcode - OpAtomicExchange) {
      if ((opcode == OpGroupNonUniformInverseBallot) ||
         ((opcode == OpGroupNonUniformBallotBitCount && (args[3] != 0)))) {
        this->needs_subgroup_invocation_id = true;
      }
      goto switchD_002872cc_caseD_3a;
    }
    this->uses_atomics = true;
    p_Var7 = (_Hash_node_base *)0x0;
    p_Var3 = ::std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::_M_find_before_node
                       (&(this->image_pointers)._M_h,
                        (ulong)args[2] % (this->image_pointers)._M_h._M_bucket_count,args + 2,
                        (ulong)args[2]);
    if (p_Var3 != (__node_base_ptr)0x0) {
      p_Var7 = p_Var3->_M_nxt;
    }
    if (p_Var7 != (_Hash_node_base *)0x0) {
      local_40 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&this->compiler->atomic_image_vars;
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                (local_40,(undefined1 *)((long)&p_Var7[1]._M_nxt + 4));
    }
    var_id = args[2];
  }
  check_resource_write(this,var_id);
switchD_002872cc_caseD_3a:
  bVar2 = Compiler::instruction_to_result_type
                    ((Compiler *)this->compiler,(uint32_t *)&local_40,&local_44,opcode,args,length);
  if (bVar2) {
    mVar1 = (mapped_type)local_40;
    pmVar4 = ::std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->result_types,&local_44);
    *pmVar4 = mVar1;
  }
  return true;
}

Assistant:

bool CompilerMSL::OpCodePreprocessor::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	// Since MSL exists in a single execution scope, function prototype declarations are not
	// needed, and clutter the output. If secondary functions are output (either as a SPIR-V
	// function implementation or as indicated by the presence of OpFunctionCall), then set
	// suppress_missing_prototypes to suppress compiler warnings of missing function prototypes.

	// Mark if the input requires the implementation of an SPIR-V function that does not exist in Metal.
	SPVFuncImpl spv_func = get_spv_func_impl(opcode, args);
	if (spv_func != SPVFuncImplNone)
	{
		compiler.spv_function_implementations.insert(spv_func);
		suppress_missing_prototypes = true;
	}

	switch (opcode)
	{

	case OpFunctionCall:
		suppress_missing_prototypes = true;
		break;

	// Emulate texture2D atomic operations
	case OpImageTexelPointer:
	{
		auto *var = compiler.maybe_get_backing_variable(args[2]);
		image_pointers[args[1]] = var ? var->self : ID(0);
		break;
	}

	case OpImageWrite:
		uses_resource_write = true;
		break;

	case OpStore:
		check_resource_write(args[0]);
		break;

	// Emulate texture2D atomic operations
	case OpAtomicExchange:
	case OpAtomicCompareExchange:
	case OpAtomicCompareExchangeWeak:
	case OpAtomicIIncrement:
	case OpAtomicIDecrement:
	case OpAtomicIAdd:
	case OpAtomicISub:
	case OpAtomicSMin:
	case OpAtomicUMin:
	case OpAtomicSMax:
	case OpAtomicUMax:
	case OpAtomicAnd:
	case OpAtomicOr:
	case OpAtomicXor:
	{
		uses_atomics = true;
		auto it = image_pointers.find(args[2]);
		if (it != image_pointers.end())
		{
			compiler.atomic_image_vars.insert(it->second);
		}
		check_resource_write(args[2]);
		break;
	}

	case OpAtomicStore:
	{
		uses_atomics = true;
		auto it = image_pointers.find(args[0]);
		if (it != image_pointers.end())
		{
			compiler.atomic_image_vars.insert(it->second);
		}
		check_resource_write(args[0]);
		break;
	}

	case OpAtomicLoad:
	{
		uses_atomics = true;
		auto it = image_pointers.find(args[2]);
		if (it != image_pointers.end())
		{
			compiler.atomic_image_vars.insert(it->second);
		}
		break;
	}

	case OpGroupNonUniformInverseBallot:
		needs_subgroup_invocation_id = true;
		break;

	case OpGroupNonUniformBallotBitCount:
		if (args[3] != GroupOperationReduce)
			needs_subgroup_invocation_id = true;
		break;

	case OpArrayLength:
	{
		auto *var = compiler.maybe_get_backing_variable(args[2]);
		if (var)
			compiler.buffers_requiring_array_length.insert(var->self);
		break;
	}

	case OpInBoundsAccessChain:
	case OpAccessChain:
	case OpPtrAccessChain:
	{
		// OpArrayLength might want to know if taking ArrayLength of an array of SSBOs.
		uint32_t result_type = args[0];
		uint32_t id = args[1];
		uint32_t ptr = args[2];

		compiler.set<SPIRExpression>(id, "", result_type, true);
		compiler.register_read(id, ptr, true);
		compiler.ir.ids[id].set_allow_type_rewrite();
		break;
	}

	default:
		break;
	}

	// If it has one, keep track of the instruction's result type, mapped by ID
	uint32_t result_type, result_id;
	if (compiler.instruction_to_result_type(result_type, result_id, opcode, args, length))
		result_types[result_id] = result_type;

	return true;
}